

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_initCStream(ZSTDMT_CCtx *mtctx,int compressionLevel)

{
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  ZSTD_CCtx_params in_stack_fffffffffffffe98;
  ZSTD_compressionParameters local_d0;
  undefined4 local_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [32];
  undefined8 local_88;
  undefined4 local_80;
  
  bVar5 = 0;
  ZSTD_getCParams_internal(&local_d0,compressionLevel,0xffffffffffffffff,0);
  uStack_b0 = 0;
  uStack_ac = 0;
  local_b4 = 1;
  memcpy(local_a8,&mtctx->params,0x90);
  local_a8._4_4_ = local_d0.windowLog;
  local_a8._8_4_ = local_d0.chainLog;
  local_a8._24_4_ = local_d0.targetLength;
  local_a8._28_4_ = local_d0.strategy;
  local_88 = CONCAT44(uStack_b0,local_b4);
  local_80 = uStack_ac;
  puVar3 = (undefined8 *)local_a8;
  puVar4 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  sVar1 = ZSTDMT_initCStream_internal
                    (mtctx,(void *)0x0,0,ZSTD_dct_auto,(ZSTD_CDict *)0x0,in_stack_fffffffffffffe98,
                     0xffffffffffffffff);
  return sVar1;
}

Assistant:

size_t ZSTDMT_initCStream(ZSTDMT_CCtx* mtctx, int compressionLevel) {
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, 0);
    ZSTD_CCtx_params cctxParams = mtctx->params;   /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream (cLevel=%i)", compressionLevel);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0, ZSTD_dct_auto, NULL, cctxParams, ZSTD_CONTENTSIZE_UNKNOWN);
}